

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq_addon.hpp
# Opt level: O0

recv_result_t __thiscall
zmq::detail::recv_multipart_n<true,zmq::message_t*>
          (detail *this,socket_ref s,message_t *out,size_t n,recv_flags flags)

{
  bool bVar1;
  runtime_error *this_00;
  size_t __n;
  undefined8 extraout_RDX;
  recv_result_t rVar2;
  bool more;
  size_t sStack_a0;
  undefined1 local_80 [8];
  message_t msg;
  size_t msg_count;
  recv_flags flags_local;
  size_t n_local;
  message_t *out_local;
  socket_ref s_local;
  bool local_10;
  
  msg.msg._[0x38] = '\0';
  msg.msg._[0x39] = '\0';
  msg.msg._[0x3a] = '\0';
  msg.msg._[0x3b] = '\0';
  msg.msg._[0x3c] = '\0';
  msg.msg._[0x3d] = '\0';
  msg.msg._[0x3e] = '\0';
  msg.msg._[0x3f] = '\0';
  __n = n;
  out_local = (message_t *)this;
  message_t::message_t((message_t *)local_80);
  n_local = (size_t)s.super_socket_base._handle;
  while( true ) {
    if (out <= (ulong)msg.msg._._56_8_) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Too many message parts in recv_multipart_n");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    __n = socket_base::recv((socket_base *)&out_local,(int)local_80,(void *)(n & 0xffffffff),__n,
                            flags);
    sStack_a0 = __n;
    bVar1 = std::optional::operator_cast_to_bool((optional *)&stack0xffffffffffffff60);
    if (((bVar1 ^ 0xffU) & 1) != 0) break;
    msg.msg._._56_8_ = msg.msg._._56_8_ + 1;
    bVar1 = message_t::more((message_t *)local_80);
    message_t::operator=((message_t *)n_local,(message_t *)local_80);
    n_local = n_local + 0x40;
    if (!bVar1) {
      std::optional<unsigned_long>::optional<unsigned_long,_true>
                ((optional<unsigned_long> *)&s_local,(unsigned_long *)(msg.msg._ + 0x38));
LAB_00176cb5:
      message_t::~message_t((message_t *)local_80);
      rVar2.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._9_7_ = (undefined7)((ulong)extraout_RDX >> 8);
      rVar2.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_engaged = local_10;
      rVar2.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_payload =
           (_Storage<unsigned_long,_true>)s_local.super_socket_base._handle;
      return (recv_result_t)
             rVar2.super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>;
    }
  }
  if (msg.msg._._56_8_ != 0) {
    __assert_fail("msg_count == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/zeromq[P]cppzmq/zmq_addon.hpp",
                  0x75,
                  "recv_result_t zmq::detail::recv_multipart_n(socket_ref, OutputIt, size_t, recv_flags) [CheckN = true, OutputIt = zmq::message_t *]"
                 );
  }
  std::optional<unsigned_long>::optional((optional<unsigned_long> *)&s_local);
  goto LAB_00176cb5;
}

Assistant:

recv_result_t
recv_multipart_n(socket_ref s, OutputIt out, size_t n, recv_flags flags)
{
    size_t msg_count = 0;
    message_t msg;
    while (true) {
        if ZMQ_CONSTEXPR_IF (CheckN) {
            if (msg_count >= n)
                throw std::runtime_error(
                  "Too many message parts in recv_multipart_n");
        }
        if (!s.recv(msg, flags)) {
            // zmq ensures atomic delivery of messages
            assert(msg_count == 0);
            return {};
        }
        ++msg_count;
        const bool more = msg.more();
        *out++ = std::move(msg);
        if (!more)
            break;
    }
    return msg_count;
}